

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode cr_eob_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                    _Bool *peos)

{
  bufq *pbVar1;
  void *pvVar2;
  long lVar3;
  _Bool _Var4;
  CURLcode CVar5;
  void *pvVar6;
  size_t sVar7;
  byte bVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char *__s;
  _Bool eos;
  size_t n;
  size_t nread;
  _Bool local_69;
  size_t *local_68;
  _Bool *local_60;
  char *local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  Curl_easy *local_38;
  
  pvVar2 = reader->ctx;
  local_68 = pnread;
  local_50 = blen;
  if ((*(byte *)((long)pvVar2 + 0x70) & 1) == 0) {
    pbVar1 = (bufq *)((long)pvVar2 + 0x20);
    _Var4 = Curl_bufq_is_empty(pbVar1);
    if (_Var4) {
      CVar5 = Curl_creader_read(data,reader->next,buf,local_50,&local_40,&local_69);
      sVar7 = local_40;
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      *(byte *)((long)pvVar2 + 0x70) = *(byte *)((long)pvVar2 + 0x70) & 0xfe | local_69;
      local_60 = peos;
      if (local_40 != 0) {
        uVar12 = *(ulong *)((long)pvVar2 + 0x60);
        if ((uVar12 == 0) && (pvVar6 = memchr(buf,0xd,local_40), pvVar6 == (void *)0x0)) {
          *local_68 = sVar7;
          _Var4 = false;
          CVar5 = CURLE_OK;
          goto LAB_00155a74;
        }
        uVar11 = 0;
        uVar10 = 0;
        local_58 = buf;
        local_38 = data;
        do {
          if (2 < uVar12) {
            CVar5 = Curl_bufq_cwrite(pbVar1,buf + uVar11,uVar10 - uVar11,&local_48);
            if (CVar5 != CURLE_OK) {
              return CVar5;
            }
            CVar5 = Curl_bufq_cwrite(pbVar1,".",1,&local_48);
            if (CVar5 != CURLE_OK) {
              return CVar5;
            }
            *(undefined8 *)((long)pvVar2 + 0x60) = 0;
            lVar3 = (local_38->state).infilesize;
            if (0 < lVar3) {
              (local_38->state).infilesize = lVar3 + 1;
            }
            uVar12 = 0;
            uVar11 = uVar10;
            buf = local_58;
          }
          if (buf[uVar10] == ".\r\n.\r\n"[uVar12 + 1]) {
LAB_00155986:
            uVar12 = uVar12 + 1;
            *(ulong *)((long)pvVar2 + 0x60) = uVar12;
          }
          else {
            *(undefined8 *)((long)pvVar2 + 0x60) = 0;
            uVar12 = 0;
            if (buf[uVar10] == '\r') goto LAB_00155986;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < local_40);
        if ((uVar11 <= local_40 && local_40 - uVar11 != 0) &&
           (CVar5 = Curl_bufq_cwrite(pbVar1,buf + uVar11,local_40 - uVar11,&local_48),
           CVar5 != CURLE_OK)) {
          return CVar5;
        }
      }
      peos = local_60;
      if ((*(byte *)((long)pvVar2 + 0x70) & 1) != 0) {
        pcVar9 = "\r\n.\r\n";
        if (*(long *)((long)pvVar2 + 0x60) == 3) {
          pcVar9 = ".\r\n.\r\n";
        }
        __s = ".\r\n";
        if (*(long *)((long)pvVar2 + 0x60) != 2) {
          __s = pcVar9;
        }
        sVar7 = strlen(__s);
        CVar5 = Curl_bufq_cwrite(pbVar1,__s,sVar7,&local_48);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
      }
    }
  }
  *peos = false;
  pbVar1 = (bufq *)((long)pvVar2 + 0x20);
  _Var4 = Curl_bufq_is_empty(pbVar1);
  if (_Var4) {
    *local_68 = 0;
    CVar5 = CURLE_OK;
  }
  else {
    CVar5 = Curl_bufq_cread(pbVar1,buf,local_50,local_68);
  }
  bVar8 = *(byte *)((long)pvVar2 + 0x70);
  if ((bVar8 & 1) != 0) {
    _Var4 = Curl_bufq_is_empty(pbVar1);
    bVar8 = *(byte *)((long)pvVar2 + 0x70);
    if (_Var4) {
      bVar8 = bVar8 | 2;
      *(byte *)((long)pvVar2 + 0x70) = bVar8;
    }
  }
  _Var4 = (_Bool)(bVar8 >> 1 & 1);
  local_60 = peos;
LAB_00155a74:
  *local_60 = _Var4;
  return CVar5;
}

Assistant:

static CURLcode cr_eob_read(struct Curl_easy *data,
                            struct Curl_creader *reader,
                            char *buf, size_t blen,
                            size_t *pnread, bool *peos)
{
  struct cr_eob_ctx *ctx = reader->ctx;
  CURLcode result = CURLE_OK;
  size_t nread, i, start, n;
  bool eos;

  if(!ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* Get more and convert it when needed */
    result = Curl_creader_read(data, reader->next, buf, blen, &nread, &eos);
    if(result)
      return result;

    ctx->read_eos = eos;
    if(nread) {
      if(!ctx->n_eob && !memchr(buf, SMTP_EOB[0], nread)) {
        /* not in the middle of a match, no EOB start found, just pass */
        *pnread = nread;
        *peos = FALSE;
        return CURLE_OK;
      }
      /* scan for EOB (continuation) and convert */
      for(i = start = 0; i < nread; ++i) {
        if(ctx->n_eob >= SMTP_EOB_FIND_LEN) {
          /* matched the EOB prefix and seeing additional char, add '.' */
          result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
          if(result)
            return result;
          result = Curl_bufq_cwrite(&ctx->buf, ".", 1, &n);
          if(result)
            return result;
          ctx->n_eob = 0;
          start = i;
          if(data->state.infilesize > 0)
            data->state.infilesize++;
        }

        if(buf[i] != SMTP_EOB[ctx->n_eob])
          ctx->n_eob = 0;

        if(buf[i] == SMTP_EOB[ctx->n_eob]) {
          /* matching another char of the EOB */
          ++ctx->n_eob;
        }
      }

      /* add any remainder to buf */
      if(start < nread) {
        result = Curl_bufq_cwrite(&ctx->buf, buf + start, nread - start, &n);
        if(result)
          return result;
      }
    }

    if(ctx->read_eos) {
      /* if we last matched a CRLF or if the data was empty, add ".\r\n"
       * to end the body. If we sent something and it did not end with "\r\n",
       * add "\r\n.\r\n" to end the body */
      const char *eob = SMTP_EOB;
      switch(ctx->n_eob) {
        case 2:
          /* seen a CRLF at the end, just add the remainder */
          eob = &SMTP_EOB[2];
          break;
        case 3:
          /* ended with '\r\n.', we should escpe the last '.' */
          eob = "." SMTP_EOB;
          break;
        default:
          break;
      }
      result = Curl_bufq_cwrite(&ctx->buf, eob, strlen(eob), &n);
      if(result)
        return result;
    }
  }

  *peos = FALSE;
  if(!Curl_bufq_is_empty(&ctx->buf)) {
    result = Curl_bufq_cread(&ctx->buf, buf, blen, pnread);
  }
  else
    *pnread = 0;

  if(ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* no more data, read all, done. */
    ctx->eos = TRUE;
  }
  *peos = ctx->eos;
  DEBUGF(infof(data, "cr_eob_read(%zu) -> %d, %zd, %d",
         blen, result, *pnread, *peos));
  return result;
}